

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::ExtractSnapFunctionBodyScopeChain
               (bool isWellKnownFunction,SnapFunctionBodyScopeChain *scopeChain,FunctionBody *fb,
               SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  ScopeObjectChain *pSVar3;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar4;
  unsigned_long *puVar5;
  WriteBarrierPtr *this;
  DebuggerScope **ppDVar6;
  DebuggerScope *dbgScope;
  int32 i;
  ScopeObjectChain *scChain;
  SlabAllocator *alloc_local;
  FunctionBody *fb_local;
  SnapFunctionBodyScopeChain *scopeChain_local;
  bool isWellKnownFunction_local;
  
  scopeChain->ScopeCount = 0;
  scopeChain->ScopeArray = (TTD_PTR_ID *)0x0;
  if ((!isWellKnownFunction) &&
     (pSVar3 = Js::FunctionBody::GetScopeObjectChain(fb), pSVar3 != (ScopeObjectChain *)0x0)) {
    pSVar3 = Js::FunctionBody::GetScopeObjectChain(fb);
    pLVar4 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->(&pSVar3->pScopeChain);
    uVar1 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>::Count
                      (&pLVar4->
                        super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>);
    scopeChain->ScopeCount = uVar1;
    if (scopeChain->ScopeCount == 0) {
      scopeChain->ScopeArray = (TTD_PTR_ID *)0x0;
    }
    else {
      puVar5 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>
                         (alloc,(ulong)scopeChain->ScopeCount);
      scopeChain->ScopeArray = puVar5;
      dbgScope._4_4_ = 0;
      while( true ) {
        pLVar4 = Memory::
                 WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                 ::operator->(&pSVar3->pScopeChain);
        iVar2 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>::Count
                          (&pLVar4->
                            super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>
                          );
        if (iVar2 <= dbgScope._4_4_) break;
        pLVar4 = Memory::
                 WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                 ::operator->(&pSVar3->pScopeChain);
        this = (WriteBarrierPtr *)
               JsUtil::
               List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(pLVar4,dbgScope._4_4_);
        ppDVar6 = Memory::WriteBarrierPtr::operator_cast_to_DebuggerScope__(this);
        scopeChain->ScopeArray[dbgScope._4_4_] = (TTD_PTR_ID)*ppDVar6;
        dbgScope._4_4_ = dbgScope._4_4_ + 1;
      }
    }
  }
  return;
}

Assistant:

void ExtractSnapFunctionBodyScopeChain(bool isWellKnownFunction, SnapFunctionBodyScopeChain& scopeChain, Js::FunctionBody* fb, SlabAllocator& alloc)
        {
            scopeChain.ScopeCount = 0;
            scopeChain.ScopeArray = nullptr;

            if(!isWellKnownFunction && fb->GetScopeObjectChain() != nullptr)
            {
                Js::ScopeObjectChain* scChain = fb->GetScopeObjectChain();
                scopeChain.ScopeCount = (uint32)scChain->pScopeChain->Count();

                if(scopeChain.ScopeCount == 0)
                {
                    scopeChain.ScopeArray = nullptr;
                }
                else
                {
                    scopeChain.ScopeArray = alloc.SlabAllocateArray<TTD_PTR_ID>(scopeChain.ScopeCount);

                    for(int32 i = 0; i < scChain->pScopeChain->Count(); ++i)
                    {
                        Js::DebuggerScope* dbgScope = scChain->pScopeChain->Item(i);
                        scopeChain.ScopeArray[i] = TTD_CONVERT_DEBUGSCOPE_TO_PTR_ID(dbgScope);
                    }
                }
            }
        }